

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.y.hpp
# Opt level: O0

void __thiscall deci::parser_t::value_type::move<double>(value_type *this,self_type *that)

{
  double *u;
  self_type *that_local;
  value_type *this_local;
  
  u = as<double>(that);
  emplace<double,double>(this,u);
  destroy<double>(that);
  return;
}

Assistant:

void
    move (self_type&& that)
    {
      emplace<T> (std::move (that.as<T> ()));
      that.destroy<T> ();
    }